

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterYs<unsigned_long_long>>
               (GetterYs<unsigned_long_long> getter,TransformerLogLog transformer,
               ImDrawList *DrawList,ImPlotMarker marker,float size,bool rend_mk_line,
               ImU32 col_mk_line,float weight,bool rend_mk_fill,ImU32 col_mk_fill)

{
  unsigned_long_long uVar1;
  ImPlotPlot *pIVar2;
  ImPlotContext *pIVar3;
  int iVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  float fVar8;
  ImVec2 c;
  ImVec2 local_b8;
  uint local_ac;
  uint local_a8;
  float local_a4;
  ImU32 local_a0;
  float local_9c;
  long local_98;
  ImDrawList *local_90;
  long local_88;
  ulong local_80;
  unsigned_long_long *local_78;
  double local_70;
  double local_68;
  ImPlotContext *local_60;
  double local_58;
  double local_50;
  undefined1 local_48 [16];
  
  if (0 < getter.Count) {
    local_60 = GImPlot;
    local_68 = getter.X0;
    local_70 = getter.XScale;
    local_78 = getter.Ys;
    local_80 = (ulong)(uint)getter.Offset;
    local_88 = (long)getter.Stride;
    local_98 = (long)marker;
    iVar4 = 0;
    local_50 = 0.0;
    local_a8 = (uint)rend_mk_line;
    local_ac = (uint)rend_mk_fill;
    local_a4 = size;
    local_a0 = col_mk_line;
    local_9c = weight;
    local_90 = DrawList;
    do {
      pIVar3 = GImPlot;
      uVar1 = *(unsigned_long_long *)
               ((long)local_78 +
               ((((int)local_80 + iVar4) % getter.Count + getter.Count) % getter.Count) * local_88);
      dVar7 = (double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25;
      local_48._8_4_ = SUB84(dVar7,0);
      local_48._0_8_ = dVar7 + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
      local_48._12_4_ = (int)((ulong)dVar7 >> 0x20);
      dVar7 = log10((local_70 * local_50 + local_68) / (GImPlot->CurrentPlot->XAxis).Range.Min);
      pIVar2 = pIVar3->CurrentPlot;
      local_58 = (pIVar2->XAxis).Range.Min;
      local_58 = (double)(float)(dVar7 / pIVar3->LogDenX) * ((pIVar2->XAxis).Range.Max - local_58) +
                 local_58;
      dVar6 = log10((double)local_48._0_8_ / pIVar2->YAxis[transformer.YAxis].Range.Min);
      pIVar2 = pIVar3->CurrentPlot;
      dVar7 = pIVar2->YAxis[transformer.YAxis].Range.Min;
      fVar8 = (float)((local_58 - (pIVar2->XAxis).Range.Min) * pIVar3->Mx +
                     (double)pIVar3->PixelRange[transformer.YAxis].Min.x);
      fVar5 = (float)((((double)(float)(dVar6 / pIVar3->LogDenY[transformer.YAxis]) *
                        (pIVar2->YAxis[transformer.YAxis].Range.Max - dVar7) + dVar7) - dVar7) *
                      pIVar3->My[transformer.YAxis] +
                     (double)pIVar3->PixelRange[transformer.YAxis].Min.y);
      local_b8.y = fVar5;
      local_b8.x = fVar8;
      pIVar2 = local_60->CurrentPlot;
      if (((((pIVar2->PlotRect).Min.x <= fVar8) && ((pIVar2->PlotRect).Min.y <= fVar5)) &&
          (fVar8 < (pIVar2->PlotRect).Max.x)) && (fVar5 < (pIVar2->PlotRect).Max.y)) {
        (*RenderMarkers<ImPlot::TransformerLogLog,_ImPlot::GetterYs<unsigned_long_long>_>::
          marker_table[local_98])
                  (local_90,&local_b8,local_a4,SUB41(local_a8,0),local_a0,SUB41(local_ac,0),
                   col_mk_fill,local_9c);
      }
      local_50 = local_50 + 1.0;
      iVar4 = iVar4 + 1;
    } while (getter.Count != iVar4);
  }
  return;
}

Assistant:

inline void RenderMarkers(Getter getter, Transformer transformer, ImDrawList& DrawList, ImPlotMarker marker, float size, bool rend_mk_line, ImU32 col_mk_line, float weight, bool rend_mk_fill, ImU32 col_mk_fill) {
    static void (*marker_table[ImPlotMarker_COUNT])(ImDrawList&, const ImVec2&, float s, bool, ImU32, bool, ImU32, float) = {
        RenderMarkerCircle,
        RenderMarkerSquare,
        RenderMarkerDiamond ,
        RenderMarkerUp ,
        RenderMarkerDown ,
        RenderMarkerLeft,
        RenderMarkerRight,
        RenderMarkerCross,
        RenderMarkerPlus,
        RenderMarkerAsterisk
    };
    ImPlotContext& gp = *GImPlot;
    for (int i = 0; i < getter.Count; ++i) {
        ImVec2 c = transformer(getter(i));
        if (gp.CurrentPlot->PlotRect.Contains(c))
            marker_table[marker](DrawList, c, size, rend_mk_line, col_mk_line, rend_mk_fill, col_mk_fill, weight);
    }
}